

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::pair<int,_TPZFront<double>::STensorProductMTData_*>_*>::Resize
          (TPZVec<std::pair<int,_TPZFront<double>::STensorProductMTData_*>_*> *this,int64_t newsize,
          pair<int,_TPZFront<double>::STensorProductMTData_*> **object)

{
  pair<int,_TPZFront<double>::STensorProductMTData_*> **pppVar1;
  pair<int,_TPZFront<double>::STensorProductMTData_*> *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pair<int,_TPZFront<double>::STensorProductMTData_*> **pppVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar9 = this->fNElements;
  if (lVar9 != newsize) {
    if (newsize == 0) {
      pppVar5 = (pair<int,_TPZFront<double>::STensorProductMTData_*> **)0x0;
    }
    else {
      pppVar5 = (pair<int,_TPZFront<double>::STensorProductMTData_*> **)
                operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8);
    }
    if (newsize <= lVar9) {
      lVar9 = newsize;
    }
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    else {
      pppVar1 = this->fStore;
      lVar6 = 0;
      do {
        pppVar5[lVar6] = pppVar1[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar9 != lVar6);
    }
    auVar4 = _DAT_014d28c0;
    auVar3 = _DAT_014d28b0;
    lVar6 = newsize - lVar9;
    if (lVar6 != 0 && lVar9 <= newsize) {
      ppVar2 = *object;
      lVar7 = lVar6 + -1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar10 = auVar10 ^ _DAT_014d28c0;
      do {
        auVar11._8_4_ = (int)uVar8;
        auVar11._0_8_ = uVar8;
        auVar11._12_4_ = (int)(uVar8 >> 0x20);
        auVar11 = (auVar11 | auVar3) ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                    auVar10._4_4_ < auVar11._4_4_) & 1)) {
          pppVar5[lVar9 + uVar8] = ppVar2;
        }
        if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
            auVar11._12_4_ <= auVar10._12_4_) {
          pppVar5[lVar9 + uVar8 + 1] = ppVar2;
        }
        uVar8 = uVar8 + 2;
      } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar8);
    }
    if (this->fStore != (pair<int,_TPZFront<double>::STensorProductMTData_*> **)0x0) {
      operator_delete__(this->fStore);
    }
    this->fStore = pppVar5;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}